

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O2

int archive_compressor_bzip2_write(archive_write_filter *f,void *buff,size_t length)

{
  private_data_conflict4 *data;
  int iVar1;
  
  data = (private_data_conflict4 *)f->data;
  data->total_in = data->total_in + length;
  (data->stream).next_in = (char *)buff;
  (data->stream).avail_in = (uint)length;
  iVar1 = drive_compressor(f,data,0);
  if (iVar1 != 0) {
    iVar1 = -0x1e;
  }
  return iVar1;
}

Assistant:

static int
archive_compressor_bzip2_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *data = (struct private_data *)f->data;

	/* Update statistics */
	data->total_in += length;

	/* Compress input data to output buffer */
	SET_NEXT_IN(data, buff);
	data->stream.avail_in = (uint32_t)length;
	if (drive_compressor(f, data, 0))
		return (ARCHIVE_FATAL);
	return (ARCHIVE_OK);
}